

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O3

void * udbg_knownIssue_openU
                 (void *ptr,char *ticket,char *where,UChar *msg,UBool *firstForTicket,
                 UBool *firstForWhere)

{
  _Rb_tree_header *p_Var1;
  
  if (ptr == (void *)0x0) {
    ptr = operator_new(0x30);
    p_Var1 = &(((KnownIssues *)ptr)->fTable)._M_t._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(((KnownIssues *)ptr)->fTable)._M_t._M_impl = 0;
    *(undefined8 *)&(((KnownIssues *)ptr)->fTable)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (((KnownIssues *)ptr)->fTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (((KnownIssues *)ptr)->fTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (((KnownIssues *)ptr)->fTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (((KnownIssues *)ptr)->fTable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  KnownIssues::add((KnownIssues *)ptr,ticket,where,msg,firstForTicket,firstForWhere);
  return (KnownIssues *)ptr;
}

Assistant:

U_CAPI void *udbg_knownIssue_openU(void *ptr, const char *ticket, char *where, const UChar *msg, UBool *firstForTicket,
                                   UBool *firstForWhere) {
  KnownIssues *t = static_cast<KnownIssues*>(ptr);
  if(t==NULL) {
    t = new KnownIssues();
  }

  t->add(ticket, where, msg, firstForTicket, firstForWhere);

  return static_cast<void*>(t);
}